

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

TypeArray * __thiscall
soul::AST::Function::getParameterTypes(TypeArray *__return_storage_ptr__,Function *this)

{
  pointer ppVar1;
  pointer ppVar2;
  Type local_40;
  
  __return_storage_ptr__->items = (Type *)__return_storage_ptr__->space;
  __return_storage_ptr__->numActive = 0;
  __return_storage_ptr__->numAllocated = 8;
  ArrayWithPreallocation<soul::Type,_8UL>::reserve
            (__return_storage_ptr__,
             (long)(this->parameters).
                   super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->parameters).
                   super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppVar1 = (this->parameters).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (this->parameters).
                super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    VariableDeclaration::getType(&local_40,ppVar2->object);
    ArrayWithPreallocation<soul::Type,_8UL>::push_back(__return_storage_ptr__,&local_40);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_40.structure);
  }
  return __return_storage_ptr__;
}

Assistant:

TypeArray getParameterTypes() const
        {
            TypeArray types;
            types.reserve (parameters.size());

            for (auto& param : parameters)
                types.push_back (param->getType());

            return types;
        }